

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vswprint.c
# Opt level: O2

int vswprintf_s(char16_t_conflict *string,size_t sizeInWords,char16_t_conflict *format,
               __va_list_tag *ap)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  size_t __n;
  __va_list_tag *in_R8;
  tSafeCRT_AssertFuncPtr p_Var5;
  ulong uVar6;
  
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || format != (char16_t_conflict *)0x0) {
    if (format != (char16_t_conflict *)0x0) {
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
          (sizeInWords == 0 || string == (char16_t_conflict *)0x0)) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInWords > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x94);
      }
      if (sizeInWords == 0 || string == (char16_t_conflict *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
          return -1;
        }
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInWords > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x94);
        return -1;
      }
      iVar1 = _vswprintf_helper((WOUTPUTFN)string,(char16_t_conflict *)sizeInWords,(size_t)format,
                                (char16_t_conflict *)ap,in_R8);
      if (-1 < iVar1) {
        if (sizeInWords == 0xffffffffffffffff) {
          return iVar1;
        }
        if (sizeInWords == 0x7fffffff) {
          return iVar1;
        }
        uVar3 = (ulong)(iVar1 + 1);
        uVar6 = sizeInWords - uVar3;
        if (sizeInWords < uVar3 || uVar6 == 0) {
          return iVar1;
        }
        __n = 0x10;
        if (uVar6 < 9) {
          __n = uVar6 * 2;
        }
        memset(string + uVar3,0xfd,__n);
        return iVar1;
      }
      *string = 0;
      if (((sizeInWords != 0xffffffffffffffff) && (sizeInWords != 1)) && (sizeInWords != 0x7fffffff)
         ) {
        iVar4 = 8;
        if (sizeInWords - 1 < 8) {
          iVar4 = (int)(sizeInWords - 1);
        }
        memset(string + 1,0xfd,(ulong)(uint)(iVar4 * 2));
      }
      if (iVar1 != -2) {
        return iVar1;
      }
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        p_Var5 = (tSafeCRT_AssertFuncPtr)0x0;
      }
      else {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x9e);
        p_Var5 = sMBUSafeCRTAssertFunc;
      }
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      if (p_Var5 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      (*p_Var5)("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                ,0x9e);
      return -1;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
               ,0x93);
  }
  p_Var5 = sMBUSafeCRTAssertFunc;
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  if (p_Var5 != (tSafeCRT_AssertFuncPtr)0x0) {
    (*p_Var5)("\"format != NULL\"","SafeCRT assert failed",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
              ,0x93);
  }
  return -1;
}

Assistant:

int __cdecl _vswprintf_s (
        char16_t *string,
        size_t sizeInWords,
        const char16_t *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInWords > 0, EINVAL, -1);

    retvalue = _vswprintf_helper(_woutput_s, string, sizeInWords, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInWords, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInWords, retvalue + 1);
    }

    return retvalue;
}